

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

char * skip_idf(char *start,char *out_idf)

{
  char cVar1;
  char *__src;
  ushort **ppuVar2;
  char *pcVar3;
  
  __src = skip_white(start);
  pcVar3 = __src;
  if (__src == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    while( true ) {
      cVar1 = *pcVar3;
      if (((long)cVar1 == 0) ||
         ((ppuVar2 = __ctype_b_loc(), cVar1 != '_' && (((*ppuVar2)[cVar1] & 0x400) == 0)))) break;
      pcVar3 = pcVar3 + 1;
    }
    *pcVar3 = '\0';
    strncpy(out_idf,__src,0xff);
    *pcVar3 = cVar1;
  }
  return pcVar3;
}

Assistant:

static char *skip_idf(char *start, char out_idf[256])
{
    char *s;
    char c;

    s = skip_white(start);
    if (s == NULL) {
        return NULL;
    }
    start = s;

    while (*s) {
        if (isalpha(*s) || *s == '_') {
            ++s;
            continue;
        }
        break;
    }
    c = *s;
    *s = 0;
    strncpy(out_idf, start, 255);
    *s = c;
    return s;
}